

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::
BindingPointCheck<glcts::(anonymous_namespace)::test_api::GL>
          (DrawIndirectBase *this,GLuint expectedValue)

{
  long lVar1;
  GLboolean value;
  GLboolean extraout_DL;
  GLboolean extraout_DL_00;
  GLboolean extraout_DL_01;
  GLboolean value_00;
  CallLogWrapper *this_00;
  GLboolean valueBool;
  GLint valueInt;
  GLfloat valueFloat;
  GLdouble valueDouble;
  DIResult status;
  byte local_36d;
  GLuint local_36c;
  string local_368;
  string local_348;
  undefined1 local_328 [8];
  ostream local_320;
  undefined1 local_1a8 [384];
  long local_28;
  
  local_1a8[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
  local_28 = 0;
  local_36c = 0xffffd8f1;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f43,(GLint *)&local_36c);
  if (local_36c != expectedValue) {
    local_28 = -1;
    local_328[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_328,
               (char (*) [72])
               "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    if (local_328[0] == (DILogger)0x0) {
      std::ostream::operator<<(&local_320,local_36c);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_320,", expected: ",0xc);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_320);
    }
    DILogger::~DILogger((DILogger *)local_328);
  }
  local_36d = expectedValue == 0;
  glu::CallLogWrapper::glGetBooleanv(this_00,0x8f43,&local_36d);
  if ((bool)local_36d != (expectedValue != 0)) {
    local_28 = -1;
    local_328[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_328,
               (char (*) [72])
               "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_348,(DrawIndirectBase *)(ulong)local_36d,value);
    value_00 = extraout_DL;
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_320,local_348._M_dataplus._M_p,local_348._M_string_length);
      value_00 = extraout_DL_00;
    }
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_320,", expected: ",0xc);
      value_00 = extraout_DL_01;
    }
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_368,(DrawIndirectBase *)(ulong)(expectedValue != 0),value_00);
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_320,
                 (char *)CONCAT44(local_368._M_dataplus._M_p._4_4_,local_368._M_dataplus._M_p._0_4_)
                 ,local_368._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_368._M_dataplus._M_p._4_4_,local_368._M_dataplus._M_p._0_4_) !=
        &local_368.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_368._M_dataplus._M_p._4_4_,local_368._M_dataplus._M_p._0_4_),
                      local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    DILogger::~DILogger((DILogger *)local_328);
  }
  local_368._M_dataplus._M_p._0_4_ = -9999.0;
  glu::CallLogWrapper::glGetFloatv(this_00,0x8f43,(GLfloat *)&local_368);
  if ((local_368._M_dataplus._M_p._0_4_ != (float)expectedValue) ||
     (NAN(local_368._M_dataplus._M_p._0_4_) || NAN((float)expectedValue))) {
    local_28 = -1;
    local_328[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_328,
               (char (*) [70])
               "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    if (local_328[0] == (DILogger)0x0) {
      std::ostream::_M_insert<double>((double)local_368._M_dataplus._M_p._0_4_);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_320,", expected: ",0xc);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_320);
    }
    DILogger::~DILogger((DILogger *)local_328);
  }
  local_348._M_dataplus._M_p = (pointer)0xc0c3878000000000;
  glu::CallLogWrapper::glGetDoublev(this_00,0x8f43,(GLdouble *)&local_348);
  if (((double)local_348._M_dataplus._M_p != (double)expectedValue) ||
     (NAN((double)local_348._M_dataplus._M_p) || NAN((double)expectedValue))) {
    local_28 = -1;
    local_328[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_320,"glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
                 ,0x46);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::ostream::_M_insert<double>((double)local_348._M_dataplus._M_p);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_320,", expected: ",0xc);
    }
    if (local_328[0] == (DILogger)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&local_320);
    }
    DILogger::~DILogger((DILogger *)local_328);
  }
  lVar1 = local_28;
  DILogger::~DILogger((DILogger *)local_1a8);
  return lVar1;
}

Assistant:

long BindingPointCheck(GLuint expectedValue)
	{
		DIResult status;

		GLint valueInt = -9999;
		glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueInt);
		if (valueInt != static_cast<GLint>(expectedValue))
		{
			status.error() << "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueInt
						   << ", expected: " << expectedValue;
		}

		GLboolean valueBool = expectedValue ? GL_FALSE : GL_TRUE;
		glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueBool);
		if (valueBool != (expectedValue ? GL_TRUE : GL_FALSE))
		{
			status.error() << "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
						   << BoolToString(valueBool)
						   << ", expected: " << BoolToString(expectedValue ? GL_TRUE : GL_FALSE);
		}

		GLfloat valueFloat		   = -9999;
		GLfloat expectedFloatValue = static_cast<GLfloat>(expectedValue);
		glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueFloat);
		if (valueFloat != expectedFloatValue)
		{
			status.error() << "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueFloat
						   << ", expected: " << expectedValue;
		}

		if (!api::isES())
		{
			GLdouble valueDouble = -9999;
			glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueDouble);
			if (valueDouble != static_cast<GLdouble>(expectedValue))
			{
				status.error() << "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
							   << valueDouble << ", expected: " << expectedValue;
			}
		}

		return status.code();
	}